

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

optional_ptr<duckdb::ProfilingNode,_true> __thiscall
duckdb::Connection::GetProfilingTree(Connection *this)

{
  type pCVar1;
  type this_00;
  type pQVar2;
  Exception *this_01;
  string local_40;
  
  pCVar1 = shared_ptr<duckdb::ClientContext,_true>::operator*(&this->context);
  if ((pCVar1->config).enable_profiler != false) {
    pCVar1 = shared_ptr<duckdb::ClientContext,_true>::operator*(&this->context);
    this_00 = unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>::
              operator*(&pCVar1->client_data);
    pQVar2 = shared_ptr<duckdb::QueryProfiler,_true>::operator*(&this_00->profiler);
    return (optional_ptr<duckdb::ProfilingNode,_true>)
           (pQVar2->root).
           super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>._M_t
           .
           super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>
           .super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl;
  }
  this_01 = (Exception *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Profiling is not enabled for this connection","");
  Exception::Exception(this_01,SETTINGS,&local_40);
  __cxa_throw(this_01,&Exception::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

optional_ptr<ProfilingNode> Connection::GetProfilingTree() {
	auto &client_config = ClientConfig::GetConfig(*context);
	auto enable_profiler = client_config.enable_profiler;

	if (!enable_profiler) {
		throw Exception(ExceptionType::SETTINGS, "Profiling is not enabled for this connection");
	}
	auto &profiler = QueryProfiler::Get(*context);
	return profiler.GetRoot();
}